

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void chold(double *A,int N)

{
  double *U22;
  size_t __n;
  ulong uVar1;
  
  U22 = (double *)malloc((long)N * (long)N * 8);
  rchold(A,N,N,U22);
  if (0 < N) {
    __n = 0;
    uVar1 = 0;
    do {
      if (__n != 0) {
        memset(A + uVar1,0,__n);
      }
      uVar1 = (ulong)(uint)((int)uVar1 + N);
      __n = __n + 8;
    } while ((ulong)(uint)N << 3 != __n);
  }
  free(U22);
  return;
}

Assistant:

void chold(double *A, int N) {
	int stride,i,j,t;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	rchold(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	
}